

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O2

void forwardMessageCMD(packet_t *recv)

{
  __type _Var1;
  ostream *poVar2;
  string *recv_00;
  int msgLength;
  int f4;
  int f3;
  int f2;
  string msg;
  string dst;
  int f1;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  int local_5c;
  string local_58;
  string local_38;
  
  local_170 = 0;
  __isoc99_sscanf((recv->_M_dataplus)._M_p,"%*s %d.%d.%d.%d %d",&local_5c,&local_164,&local_168,
                  &local_16c,&local_170);
  std::__cxx11::to_string(&local_58,local_5c);
  std::operator+(&local_c0,&local_58,".");
  std::__cxx11::to_string(&local_e0,local_164);
  std::operator+(&local_a0,&local_c0,&local_e0);
  std::operator+(&local_120,&local_a0,".");
  std::__cxx11::to_string(&local_100,local_168);
  std::operator+(&local_160,&local_120,&local_100);
  std::operator+(&local_140,&local_160,".");
  std::__cxx11::to_string(&local_38,local_16c);
  std::operator+(&local_80,&local_140,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"frwd",(allocator<char> *)&local_38);
  std::operator+(&local_58,&local_e0," ");
  std::operator+(&local_c0,&local_58,&local_80);
  std::operator+(&local_a0,&local_c0," ");
  std::__cxx11::to_string(&local_100,local_170);
  std::operator+(&local_120,&local_a0,&local_100);
  std::operator+(&local_160,&local_120," ");
  std::__cxx11::string::substr((ulong)&local_140,(ulong)recv);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"frwd",(allocator<char> *)&local_120);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_160);
  poVar2 = std::operator<<(poVar2,"> ");
  poVar2 = std::operator<<(poVar2,(string *)&local_80);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_170);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)&local_140);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_160);
  Socket::getLocalIP_abi_cxx11_(&local_160,&socketLocal);
  _Var1 = std::operator==(&local_80,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  if (_Var1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"{");
    poVar2 = std::operator<<(poVar2,(string *)&local_140);
    poVar2 = std::operator<<(poVar2,"}");
    poVar2 = std::operator<<(poVar2," packet reached destination (printed by ");
    poVar2 = std::operator<<(poVar2,(string *)&local_80);
    poVar2 = std::operator<<(poVar2,")");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    forwardMessageToNextHop(&local_80,&local_140,recv_00);
  }
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void forwardMessageCMD(const packet_t &recv) {
	int f1, f2, f3, f4;
	int msgLength = 0;
	sscanf(recv.data(), "%*s %d.%d.%d.%d %d", &f1, &f2, &f3, &f4, &msgLength);
	string dst = to_string(f1) + "." + to_string(f2) + "." + to_string(f3) + "." + to_string(f4);
	string msg = recv.substr((FORWARD_MESSAGE + " " + dst + " " + to_string(msgLength) + " ").length(),
	                         static_cast<unsigned long>(msgLength));
	cout << FORWARD_MESSAGE << "> " << dst << " " << msgLength << " " << msg << endl;
	if (dst == socketLocal.getLocalIP()) {
		cout << "{" << msg << "}" << " packet reached destination (printed by " << dst << ")" << endl;;
	} else
		forwardMessageToNextHop(dst, msg, recv);
}